

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t archive_acl_count(archive_acl *acl,wchar_t want_type)

{
  wchar_t wVar1;
  wchar_t wVar2;
  archive_acl_entry *paVar3;
  
  paVar3 = (archive_acl_entry *)&acl->acl_head;
  wVar2 = L'\0';
  while (paVar3 = paVar3->next, paVar3 != (archive_acl_entry *)0x0) {
    wVar2 = (wVar2 + L'\x01') - (uint)((paVar3->type & want_type) == 0);
  }
  wVar1 = wVar2 + L'\x03';
  if (wVar2 == L'\0') {
    wVar1 = wVar2;
  }
  if (((uint)want_type >> 8 & 1) == 0) {
    wVar1 = wVar2;
  }
  return wVar1;
}

Assistant:

int
archive_acl_count(struct archive_acl *acl, int want_type)
{
	int count;
	struct archive_acl_entry *ap;

	count = 0;
	ap = acl->acl_head;
	while (ap != NULL) {
		if ((ap->type & want_type) != 0)
			count++;
		ap = ap->next;
	}

	if (count > 0 && ((want_type & ARCHIVE_ENTRY_ACL_TYPE_ACCESS) != 0))
		count += 3;
	return (count);
}